

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O1

void testAttrFloatVectors(string *tempdir)

{
  bool bVar1;
  int iVar2;
  exr_context_t p_Var3;
  float *pfVar4;
  undefined4 *puVar5;
  char *pcVar6;
  ostream *poVar7;
  char *pcVar8;
  size_t sVar9;
  char *in_RCX;
  _internal_exr_context *pctxt;
  exr_context_t __dest;
  long unaff_R14;
  bool bVar10;
  exr_context_t f;
  exr_context_t local_20;
  
  p_Var3 = createDummyFile("<floatvector>");
  local_20 = p_Var3;
  if (p_Var3 == (exr_context_t)0x0) {
    iVar2 = 2;
  }
  else {
    iVar2 = (**(code **)(p_Var3 + 0x40))
                      (p_Var3,3,"Invalid reference to float vector object to initialize");
  }
  if (iVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n    expected: (",0x10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init (f, __null, 4)",(char *)0x1cb,0x1804e7,in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    iVar2 = 2;
  }
  else {
    in_RCX = (char *)0xfffffffc;
    iVar2 = (**(code **)(p_Var3 + 0x48))
                      (p_Var3,3,
                       "Received request to allocate negative sized float vector (%d entries)");
  }
  if (iVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n    expected: (",0x10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init (f, &fv, -4)",(char *)0x1cf,0x1804e7,in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    iVar2 = 2;
  }
  else {
    iVar2 = (**(code **)(p_Var3 + 0x40))(p_Var3,3,"Invalid (NULL) arguments to float vector create")
    ;
  }
  if (iVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n    expected: (",0x10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_create (f, __null, fdata, 4)",(char *)0x1d2,0x1804e7,
                   in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    iVar2 = 2;
  }
  else {
    iVar2 = (**(code **)(p_Var3 + 0x40))(p_Var3,3,"Invalid (NULL) arguments to float vector create")
    ;
  }
  if (iVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n    expected: (",0x10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_create (f, &fv, __null, 4)",(char *)0x1d5,0x1804e7,in_RCX)
    ;
  }
  if (p_Var3 == (exr_context_t)0x0) {
    iVar2 = 2;
  }
  else {
    in_RCX = (char *)0xfffffffc;
    iVar2 = (**(code **)(p_Var3 + 0x48))
                      (p_Var3,3,
                       "Received request to allocate negative sized float vector (%d entries)");
  }
  if (iVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n    expected: (",0x10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, -4)",(char *)0x1d8,0x1804e7,in_RCX)
    ;
  }
  if (p_Var3 == (exr_context_t)0x0) {
    iVar2 = 2;
  }
  else {
    in_RCX = (char *)0x3fffffff;
    __dest = p_Var3;
    iVar2 = (**(code **)(p_Var3 + 0x48))
                      (p_Var3,3,"Invalid too large size for float vector (%d entries)");
    if (iVar2 == 0) {
      memcpy(__dest,&DAT_0017de80,0xfffffffc);
    }
  }
  if (iVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n    expected: (",0x10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, (2147483647) / 2)",(char *)0x1de,
                   0x1804e7,in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    iVar2 = 2;
  }
  else {
    iVar2 = (**(code **)(p_Var3 + 0x40))
                      (p_Var3,3,"Invalid reference to float vector object to initialize");
  }
  if (iVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n    expected: (",0x10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init_static (f, __null, fdata, 4)",(char *)0x1e1,0x1804e7,
                   in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    iVar2 = 2;
  }
  else {
    iVar2 = (**(code **)(p_Var3 + 0x40))
                      (p_Var3,3,"Invalid reference to float array object to initialize");
  }
  if (iVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n    expected: (",0x10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init_static (f, &fv, __null, 4)",(char *)0x1e4,0x1804e7,
                   in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    iVar2 = 2;
  }
  else {
    in_RCX = (char *)0xfffffffc;
    iVar2 = (**(code **)(p_Var3 + 0x48))
                      (p_Var3,3,
                       "Received request to allocate negative sized float vector (%d entries)");
  }
  if (iVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n    expected: (",0x10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init_static (f, &fv, fdata, -4)",(char *)0x1e7,0x1804e7,
                   in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    iVar2 = 2;
    bVar1 = true;
  }
  else {
    unaff_R14 = (**(code **)(p_Var3 + 0x58))(0x10);
    if (unaff_R14 == 0) {
      iVar2 = (**(code **)(p_Var3 + 0x38))(p_Var3,1);
      bVar1 = true;
      in_RCX = (char *)0x0;
    }
    else {
      bVar1 = false;
      in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),1);
      iVar2 = 0;
    }
  }
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init (f, &fv, 4)",(char *)0x1ee,0x1804e7,in_RCX);
  }
  if (((ulong)in_RCX & 1) == 0) {
    core_test_fail("fv.length == 4",(char *)0x1ef,0x1804e7,in_RCX);
  }
  if (unaff_R14 == 0) {
    core_test_fail("fv.arr != __null",(char *)0x1f1,0x1804e7,in_RCX);
  }
  bVar10 = p_Var3 == (exr_context_t)0x0;
  pcVar6 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar10);
  if (bVar1 || bVar10) {
    iVar2 = (uint)bVar10 * 2;
  }
  else {
    (**(code **)(p_Var3 + 0x60))(unaff_R14);
    iVar2 = 0;
  }
  if (p_Var3 == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar8 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_destroy (f, &fv)",(char *)0x1f2,0x1804e7,pcVar6);
  }
  pfVar4 = (float *)(**(code **)(p_Var3 + 0x58))(0x10);
  iVar2 = 0;
  if (pfVar4 == (float *)0x0) {
    iVar2 = (**(code **)(p_Var3 + 0x38))(p_Var3,1);
  }
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar8 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x1f7,0x1804e7,pcVar6);
  }
  pfVar4[0] = 1.0;
  pfVar4[1] = 2.0;
  pfVar4[2] = 3.0;
  pfVar4[3] = 4.0;
  if (pfVar4 == (float *)0x0) {
    core_test_fail("fv.length == 4",(char *)0x1f8,0x1804e7,pcVar6);
  }
  if ((*pfVar4 == 1.0) && (!NAN(*pfVar4))) {
    if ((pfVar4[1] != 2.0) || (NAN(pfVar4[1]))) {
      core_test_fail("fv.arr[1] == 2.f",(char *)0x1fb,0x1804e7,pcVar6);
    }
    if ((pfVar4[2] != 3.0) || (NAN(pfVar4[2]))) {
      core_test_fail("fv.arr[2] == 3.f",(char *)0x1fc,0x1804e7,pcVar6);
    }
    if ((pfVar4[3] != 4.0) || (NAN(pfVar4[3]))) {
      core_test_fail("fv.arr[3] == 4.f",(char *)0x1fd,0x1804e7,pcVar6);
    }
    (**(code **)(p_Var3 + 0x60))(pfVar4);
    s_malloc_fail_on = 1;
    puVar5 = (undefined4 *)(**(code **)(p_Var3 + 0x58))(0x10);
    iVar2 = 0;
    if (puVar5 == (undefined4 *)0x0) {
      iVar2 = (**(code **)(p_Var3 + 0x38))(p_Var3,1);
    }
    if (iVar2 == 0) {
      *puVar5 = 0x3f800000;
      puVar5[1] = 0x40000000;
      puVar5[2] = 0x40400000;
      puVar5[3] = 0x40800000;
    }
    s_malloc_fail_on = 0;
    if (iVar2 == 1) {
      exr_finish(&local_20);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar8 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n    expected: (",0x10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pcVar8 = (char *)exr_get_default_error_message(1);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x201,0x1804e7,pcVar6);
  }
  core_test_fail("fv.arr[0] == 1.f",(char *)0x1fa,0x1804e7,pcVar6);
}

Assistant:

void
testAttrFloatVectors (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testFloatVectorHelper (NULL);
    exr_context_t f = createDummyFile ("<floatvector>");
    testFloatVectorHelper (f);
    exr_finish (&f);
}